

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::ColorQuant::reduceNode(ColorQuant *this,Node *node)

{
  Node *this_00;
  LLLink *pLVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  long lVar5;
  
  for (lVar5 = 4; lVar5 != 0x14; lVar5 = lVar5 + 1) {
    this_00 = node->children[lVar5 + -4];
    if (this_00 != (Node *)0x0) {
      uVar2 = this_00->g;
      uVar3 = this_00->b;
      uVar4 = this_00->a;
      node->r = node->r + this_00->r;
      node->g = node->g + uVar2;
      node->b = node->b + uVar3;
      node->a = node->a + uVar4;
      node->numPixels = node->numPixels + this_00->numPixels;
      Node::destroy(this_00);
      node->children[lVar5 + -4] = (Node *)0x0;
    }
  }
  (node->link).next = &(this->leaves).link;
  pLVar1 = (this->leaves).link.prev;
  (node->link).prev = pLVar1;
  pLVar1->next = &node->link;
  (this->leaves).link.prev = &node->link;
  return;
}

Assistant:

void
ColorQuant::reduceNode(Node *node)
{
	int i;
	assert(node->numPixels == 0);
	for(i = 0; i < 16; i++)
		if(node->children[i]){
			node->r += node->children[i]->r;
			node->g += node->children[i]->g;
			node->b += node->children[i]->b;
			node->a += node->children[i]->a;
			node->numPixels += node->children[i]->numPixels;
			node->children[i]->destroy();
			node->children[i] = nil;
		}
	assert(node->link.next == nil);
	assert(node->link.prev == nil);
	this->leaves.append(&node->link);
}